

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

ZSTD_paramSwitch_e
duckdb_zstd::ZSTD_resolveRowMatchFinderMode
          (ZSTD_paramSwitch_e mode,ZSTD_compressionParameters *cParams)

{
  int iVar1;
  uint *in_RSI;
  ZSTD_paramSwitch_e in_EDI;
  int kHasSIMD128;
  ZSTD_paramSwitch_e local_8;
  ZSTD_paramSwitch_e local_4;
  
  local_4 = in_EDI;
  if (in_EDI == ZSTD_ps_auto) {
    local_8 = ZSTD_ps_disable;
    iVar1 = ZSTD_rowMatchFinderSupported(in_RSI[6]);
    if (iVar1 == 0) {
      local_4 = ZSTD_ps_disable;
    }
    else {
      if (0xe < *in_RSI) {
        local_8 = ZSTD_ps_enable;
      }
      local_4 = local_8;
    }
  }
  return local_4;
}

Assistant:

static ZSTD_paramSwitch_e ZSTD_resolveRowMatchFinderMode(ZSTD_paramSwitch_e mode,
                                                         const ZSTD_compressionParameters* const cParams) {
#if defined(ZSTD_ARCH_X86_SSE2) || defined(ZSTD_ARCH_ARM_NEON)
    int const kHasSIMD128 = 1;
#else
    int const kHasSIMD128 = 0;
#endif
    if (mode != ZSTD_ps_auto) return mode; /* if requested enabled, but no SIMD, we still will use row matchfinder */
    mode = ZSTD_ps_disable;
    if (!ZSTD_rowMatchFinderSupported(cParams->strategy)) return mode;
    if (kHasSIMD128) {
        if (cParams->windowLog > 14) mode = ZSTD_ps_enable;
    } else {
        if (cParams->windowLog > 17) mode = ZSTD_ps_enable;
    }
    return mode;
}